

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O3

void __thiscall
NshCmdArrayLexicographicSort_Success_Test::TestBody(NshCmdArrayLexicographicSort_Success_Test *this)

{
  nsh_status_t nVar1;
  char *pcVar2;
  nsh_status_t status;
  nsh_cmd_array_t cmds;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_350;
  AssertHelper local_348;
  internal local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  nsh_status_t local_32c;
  nsh_cmd_array_t local_328;
  
  local_350._M_head_impl._0_4_ = nsh_cmd_array_init(&local_328);
  local_348.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            (local_340,"nsh_cmd_array_init(&cmds)","NSH_STATUS_OK",(nsh_status *)&local_350,
             (nsh_status *)&local_348);
  if (local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_350);
    if (local_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_338->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
  }
  else {
    if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_338,local_338);
    }
    nVar1 = nsh_cmd_array_register(&local_328,"cmd3_test",cmd3);
    local_350._M_head_impl._0_4_ = nVar1;
    local_348.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              (local_340,"nsh_cmd_array_register(&cmds, \"cmd3_test\", &cmd3)","NSH_STATUS_OK",
               (nsh_status *)&local_350,(nsh_status *)&local_348);
    if (local_340[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_350);
      if (local_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_338->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                 ,0x8f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
    }
    else {
      if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_338,local_338);
      }
      nVar1 = nsh_cmd_array_register(&local_328,"cmd1_test",cmd1);
      local_350._M_head_impl._0_4_ = nVar1;
      local_348.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                (local_340,"nsh_cmd_array_register(&cmds, \"cmd1_test\", &cmd1)","NSH_STATUS_OK",
                 (nsh_status *)&local_350,(nsh_status *)&local_348);
      if (local_340[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_350);
        if (local_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_338->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x90,pcVar2);
        testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
      }
      else {
        if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_338,local_338);
        }
        nVar1 = nsh_cmd_array_register(&local_328,"cmd2_test",cmd2);
        local_350._M_head_impl._0_4_ = nVar1;
        local_348.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                  (local_340,"nsh_cmd_array_register(&cmds, \"cmd2_test\", &cmd2)","NSH_STATUS_OK",
                   (nsh_status *)&local_350,(nsh_status *)&local_348);
        if (local_340[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_350);
          if (local_338 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = "";
          }
          else {
            pcVar2 = (local_338->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_348,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                     ,0x91,pcVar2);
          testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
        }
        else {
          if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_338,local_338);
          }
          local_32c = nsh_cmd_array_lexicographic_sort(&local_328);
          local_350._M_head_impl = local_350._M_head_impl & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                    (local_340,"status","NSH_STATUS_OK",&local_32c,(nsh_status *)&local_350);
          if (local_340[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_350);
            if (local_338 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_338->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_348,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                       ,0x94,pcVar2);
            testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
          }
          else {
            if (local_338 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_338,local_338);
            }
            testing::internal::CmpHelperSTREQ
                      (local_340,"cmds.array[0].name","\"cmd1_test\"",local_328.array[0].name,
                       "cmd1_test");
            if (local_340[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_350);
              if (local_338 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = (local_338->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_348,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                         ,0x96,pcVar2);
              testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
            }
            else {
              if (local_338 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_338,local_338);
              }
              local_350._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)cmd1;
              testing::internal::
              CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
                        (local_340,"cmds.array[0].handler","&cmd1",
                         (_func_nsh_status_uint_char_ptr_ptr **)&local_328,
                         (_func_nsh_status_uint_char_ptr_ptr **)&local_350);
              if (local_340[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_350);
                if (local_338 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = (local_338->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_348,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                           ,0x97,pcVar2);
                testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
              }
              else {
                if (local_338 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_338,local_338);
                }
                testing::internal::CmpHelperSTREQ
                          (local_340,"cmds.array[1].name","\"cmd2_test\"",local_328.array[1].name,
                           "cmd2_test");
                if (local_340[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_350);
                  if (local_338 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = (local_338->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_348,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                             ,0x98,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
                }
                else {
                  if (local_338 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_338,local_338);
                  }
                  local_350._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       cmd2;
                  testing::internal::
                  CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
                            (local_340,"cmds.array[1].handler","&cmd2",
                             (_func_nsh_status_uint_char_ptr_ptr **)(local_328.array + 1),
                             (_func_nsh_status_uint_char_ptr_ptr **)&local_350);
                  if (local_340[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_350);
                    if (local_338 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = (local_338->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_348,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                               ,0x99,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
                  }
                  else {
                    if (local_338 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_338,local_338);
                    }
                    testing::internal::CmpHelperSTREQ
                              (local_340,"cmds.array[2].name","\"cmd3_test\"",
                               local_328.array[2].name,"cmd3_test");
                    if (local_340[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_350);
                      if (local_338 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = (local_338->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_348,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                                 ,0x9a,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
                    }
                    else {
                      if (local_338 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_338,local_338);
                      }
                      local_350._M_head_impl =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)cmd3;
                      testing::internal::
                      CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
                                (local_340,"cmds.array[2].handler","&cmd3",
                                 (_func_nsh_status_uint_char_ptr_ptr **)(local_328.array + 2),
                                 (_func_nsh_status_uint_char_ptr_ptr **)&local_350);
                      if (local_340[0] != (internal)0x0) goto LAB_00117e2a;
                      testing::Message::Message((Message *)&local_350);
                      if (local_338 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = (local_338->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_348,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                                 ,0x9b,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_348);
  if (local_350._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_350._M_head_impl + 8))();
  }
LAB_00117e2a:
  if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_338,local_338);
  }
  return;
}

Assistant:

TEST(NshCmdArrayLexicographicSort, Success)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd3_test", &cmd3), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd1_test", &cmd1), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd2_test", &cmd2), NSH_STATUS_OK);

    auto status = nsh_cmd_array_lexicographic_sort(&cmds);
    ASSERT_EQ(status, NSH_STATUS_OK);

    ASSERT_STREQ(cmds.array[0].name, "cmd1_test");
    ASSERT_EQ(cmds.array[0].handler, &cmd1);
    ASSERT_STREQ(cmds.array[1].name, "cmd2_test");
    ASSERT_EQ(cmds.array[1].handler, &cmd2);
    ASSERT_STREQ(cmds.array[2].name, "cmd3_test");
    ASSERT_EQ(cmds.array[2].handler, &cmd3);
}